

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O3

bool dxil_spv::emit_create_handle
               (Impl *impl,CallInst *instruction,ResourceType resource_type,uint resource_range,
               Value *instruction_offset,bool non_uniform)

{
  UnorderedMap<spv::Id,_ResourceMeta> *pUVar1;
  mapped_type mVar2;
  pointer pLVar3;
  pointer pRVar4;
  ComponentType CVar5;
  undefined2 uVar6;
  RawVecSize RVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  uint8_t uVar13;
  undefined3 uVar14;
  uint32_t uVar15;
  bool bVar16;
  undefined4 uVar17;
  bool bVar18;
  bool bVar19;
  Id IVar20;
  StorageClass SVar21;
  uint uVar22;
  DescriptorQATypeFlagBits DVar23;
  Id IVar24;
  Id IVar25;
  Dim DVar26;
  Builder *pBVar27;
  mapped_type *pmVar28;
  mapped_type *pmVar29;
  mapped_type *pmVar30;
  mapped_type *pmVar31;
  LoggingCallback p_Var32;
  void *pvVar33;
  Builder *this;
  Operation *pOVar34;
  Operation *this_00;
  iterator iVar35;
  undefined8 uVar36;
  const_iterator cVar37;
  ResourceReference *counter;
  Value *dynamic_offset;
  CallInst *instruction_00;
  undefined7 in_register_00000011;
  ResourceReference *pRVar38;
  byte bVar39;
  long lVar40;
  undefined7 in_register_00000089;
  pointer pRVar41;
  bool is_non_uniform_3;
  Id loaded_id;
  Id resource_id_1;
  undefined4 local_10a0;
  Id resource_id;
  StorageClass local_1098;
  bool is_non_uniform;
  ResourceMetaInstrumentation instrumentation;
  Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
  Id ptr_id;
  RawWidth RStack_1034;
  undefined8 uStack_1030;
  char acStack_1028 [13];
  undefined4 uStack_101b;
  undefined4 uStack_1017;
  undefined4 uStack_1013;
  
  pBVar27 = Converter::Impl::builder(impl);
  local_10a0 = (undefined4)CONCAT71(in_register_00000089,non_uniform);
  local_1098 = resource_range;
  switch(CONCAT71(in_register_00000011,resource_type) & 0xffffffff) {
  case 0:
    if (resource_range == 0xffffffff) {
      _ptr_id = instruction;
      pmVar29 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
      pRVar38 = &pmVar29->reference;
    }
    else {
      pRVar38 = (impl->srv_index_to_reference).
                super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                ._M_impl.super__Vector_impl_data._M_start + resource_range;
    }
    if (pRVar38->resource_kind == RTAccelerationStructure) {
      this = Converter::Impl::builder(impl);
      SVar21 = spv::Builder::getStorageClass(this,pRVar38->var_id);
      if (SVar21 == StorageClassStorageBuffer) {
LAB_0015e68e:
        pBVar27 = Converter::Impl::builder(impl);
        SVar21 = spv::Builder::getStorageClass(pBVar27,pRVar38->var_id);
        if (SVar21 == StorageClassStorageBuffer) {
          dynamic_offset = (Value *)0x0;
          if (pRVar38->base_resource_is_array != false) {
            dynamic_offset = instruction_offset;
          }
          IVar20 = build_bindless_heap_offset(impl,pRVar38,0x140,dynamic_offset);
          if (!non_uniform) {
            _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x40);
            std::
            _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
            ::_M_insert_unique<spv::Capability_const&>
                      ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                        *)&pBVar27->capabilities,&ptr_id);
            IVar24 = spv::Builder::makeIntegerType(pBVar27,0x20,false);
            pOVar34 = Converter::Impl::allocate(impl,OpGroupNonUniformBroadcastFirst,IVar24);
            IVar24 = spv::Builder::makeIntegerType(pBVar27,0x20,false);
            IVar24 = spv::Builder::makeIntConstant(pBVar27,IVar24,3,false);
            Operation::add_id(pOVar34,IVar24);
            Operation::add_id(pOVar34,IVar20);
            Converter::Impl::add(impl,pOVar34,false);
            IVar20 = pOVar34->id;
          }
          IVar20 = build_physical_address_indexing_from_ssbo(impl,IVar20);
          IVar24 = spv::Builder::makeIntegerType(pBVar27,0x20,false);
          IVar24 = spv::Builder::makeVectorType(pBVar27,IVar24,2);
          IVar25 = spv::Builder::makePointer(pBVar27,StorageClassStorageBuffer,IVar24);
          pOVar34 = Converter::Impl::allocate(impl,OpAccessChain,IVar25);
          Operation::add_id(pOVar34,pRVar38->var_id);
          IVar25 = spv::Builder::makeIntegerType(pBVar27,0x20,false);
          IVar25 = spv::Builder::makeIntConstant(pBVar27,IVar25,0,false);
          Operation::add_id(pOVar34,IVar25);
          Operation::add_id(pOVar34,IVar20);
          Converter::Impl::add(impl,pOVar34,false);
          this_00 = Converter::Impl::allocate(impl,OpLoad,IVar24);
          Operation::add_id(this_00,pOVar34->id);
          Converter::Impl::add(impl,this_00,false);
          IVar20 = this_00->id;
        }
        else {
          IVar20 = build_root_descriptor_load_physical_pointer(impl,pRVar38);
        }
        IVar24 = spv::Builder::makeAccelerationStructureType(pBVar27);
        pOVar34 = Converter::Impl::allocate(impl,OpConvertUToAccelerationStructureKHR,IVar24);
        Operation::add_id(pOVar34,IVar20);
        Converter::Impl::add(impl,pOVar34,false);
        _ptr_id = (CallInst *)CONCAT44(RStack_1034,pOVar34->id);
        Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar34->id);
        pmVar30 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->handle_to_resource_meta,&ptr_id);
        pmVar30->kind = Invalid;
        pmVar30->component_type = Invalid;
        pmVar30->raw_component_vecsize = V1;
        pmVar30->stride = 0;
        pmVar30->var_id = 0;
        pRVar41 = (pmVar30->var_alias_group).
                  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (pmVar30->var_alias_group).
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pmVar30->var_alias_group).
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pmVar30->var_alias_group).
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (pRVar41 != (pointer)0x0) {
          free_in_thread(pRVar41);
        }
        pmVar30->aliased = false;
        pmVar30->non_uniform = false;
        pmVar30->counter_is_physical_pointer = false;
        pmVar30->rov = false;
        pmVar30->storage = StorageClassUniformConstant;
        pmVar30->counter_var_id = 0;
        (pmVar30->physical_pointer_meta).nonwritable = false;
        (pmVar30->physical_pointer_meta).nonreadable = false;
        (pmVar30->physical_pointer_meta).coherent = false;
        (pmVar30->physical_pointer_meta).rov = false;
        (pmVar30->physical_pointer_meta).stride = '\0';
        *(undefined8 *)&(pmVar30->physical_pointer_meta).size = 0;
        (pmVar30->instrumentation).bda_id = 0;
        (pmVar30->instrumentation).elem_size_id = 0;
        (pmVar30->instrumentation).resource_size_id = 0;
        pmVar30->storage = StorageClassGeneric;
        pmVar30->kind = RTAccelerationStructure;
        return true;
      }
      uVar22 = pRVar38->local_root_signature_entry;
      if ((long)(int)uVar22 < 0) {
        if (pRVar38->root_descriptor == true) goto LAB_0015e68e;
        goto LAB_0015e828;
      }
      if ((impl->local_root_signature).
          super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
          ._M_impl.super__Vector_impl_data._M_start[(int)uVar22].type == Descriptor)
      goto LAB_0015e68e;
LAB_0015e210:
      if ((impl->local_root_signature).
          super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar22].type == Descriptor) {
LAB_0015e227:
        IVar20 = build_root_descriptor_load_physical_pointer(impl,pRVar38);
        _ptr_id = (CallInst *)CONCAT44(RStack_1034,IVar20);
        Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar20);
        pmVar30 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->handle_to_resource_meta,&ptr_id);
        pmVar30->kind = Invalid;
        pmVar30->component_type = Invalid;
        pmVar30->raw_component_vecsize = V1;
        pmVar30->stride = 0;
        pmVar30->var_id = 0;
        pRVar41 = (pmVar30->var_alias_group).
                  super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (pmVar30->var_alias_group).
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pmVar30->var_alias_group).
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pmVar30->var_alias_group).
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (pRVar41 != (pointer)0x0) {
          free_in_thread(pRVar41);
        }
        pmVar30->aliased = false;
        pmVar30->non_uniform = false;
        pmVar30->counter_is_physical_pointer = false;
        pmVar30->rov = false;
        pmVar30->storage = StorageClassUniformConstant;
        pmVar30->counter_var_id = 0;
        (pmVar30->physical_pointer_meta).nonwritable = false;
        (pmVar30->physical_pointer_meta).nonreadable = false;
        (pmVar30->physical_pointer_meta).coherent = false;
        (pmVar30->physical_pointer_meta).rov = false;
        (pmVar30->physical_pointer_meta).stride = '\0';
        *(undefined8 *)&(pmVar30->physical_pointer_meta).size = 0;
        (pmVar30->instrumentation).bda_id = 0;
        (pmVar30->instrumentation).elem_size_id = 0;
        (pmVar30->instrumentation).resource_size_id = 0;
        pmVar30->stride = pRVar38->stride;
        pmVar30->storage = StorageClassPhysicalStorageBuffer;
        (pmVar30->physical_pointer_meta).nonwritable = true;
        pmVar30->kind = pRVar38->resource_kind;
        return true;
      }
    }
    else {
      uVar22 = pRVar38->local_root_signature_entry;
      if (-1 < (int)uVar22) goto LAB_0015e210;
LAB_0015e828:
      if ((pRVar38->root_descriptor & 1U) != 0) goto LAB_0015e227;
    }
    _is_non_uniform = _is_non_uniform & 0xffffff00;
    IVar20 = pRVar38->var_id;
    if (IVar20 == 0) {
      pRVar41 = (pRVar38->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pRVar41 ==
          (pRVar38->var_alias_group).
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        IVar20 = 0;
      }
      else {
        IVar20 = pRVar41->var_id;
      }
    }
    _ptr_id = (CallInst *)CONCAT44(RStack_1034,IVar20);
    pUVar1 = &impl->handle_to_resource_meta;
    iVar35 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&pUVar1->_M_h,&ptr_id);
    if ((iVar35.
         super__Node_iterator_base<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_false>
         ._M_cur == (__node_type *)0x0) ||
       (DVar23 = DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT,
       *(int *)((long)iVar35.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_false>
                      ._M_cur + 0x3c) != 0xc)) {
      DVar23 = DESCRIPTOR_QA_TYPE_UNIFORM_TEXEL_BUFFER_BIT;
      if (3 < (byte)(pRVar38->resource_kind - TypedBuffer)) {
        DVar23 = DESCRIPTOR_QA_TYPE_SAMPLED_IMAGE_BIT;
        if (pRVar38->resource_kind == RTAccelerationStructure) {
          DVar23 = DESCRIPTOR_QA_TYPE_RT_ACCELERATION_STRUCTURE_BIT;
        }
      }
    }
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    loaded_id = 0;
    resource_id_1 = 0;
    resource_id = 0;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::reserve(&raw_declarations,
              (long)(pRVar38->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pRVar38->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
    instrumentation.resource_size_id = 0;
    instrumentation.bda_id = 0;
    instrumentation.elem_size_id = 0;
    IVar20 = pRVar38->var_id;
    if (IVar20 != 0) {
      resource_id = IVar20;
      bVar18 = build_load_resource_handle
                         (impl,IVar20,pRVar38,DVar23,instruction,instruction_offset,local_10a0._0_1_
                          ,&is_non_uniform,(Id *)0x0,&loaded_id,&resource_id_1,&instrumentation);
      if (!bVar18) {
        p_Var32 = get_thread_log_callback();
        if (p_Var32 != (LoggingCallback)0x0) {
LAB_0015eb2f:
          builtin_strncpy(acStack_1028,"RV resou",8);
          uStack_1030._4_1_ = 'a';
          uStack_1030._5_1_ = 'd';
          uStack_1030._6_1_ = ' ';
          uStack_1030._7_1_ = 'S';
LAB_0015eef8:
          builtin_strncpy(acStack_1028 + 8,"rce h",5);
          uStack_1030._0_4_ = 0x6f6c206f;
          uVar36 = 0xa2e656c646e61;
          goto LAB_0015ef06;
        }
        emit_create_handle();
        goto LAB_0015ef1c;
      }
    }
    pRVar41 = (pRVar38->var_alias_group).
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar4 = (pRVar38->var_alias_group).
             super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar41 != pRVar4) {
      bVar18 = local_10a0._0_1_;
      do {
        resource_id = pRVar41->var_id;
        bVar19 = build_load_resource_handle
                           (impl,resource_id,pRVar38,DVar23,instruction,instruction_offset,bVar18,
                            &is_non_uniform,(Id *)0x0,&loaded_id,&resource_id_1,&instrumentation);
        if (!bVar19) {
          p_Var32 = get_thread_log_callback();
          if (p_Var32 != (LoggingCallback)0x0) goto LAB_0015eb2f;
          emit_create_handle();
          goto LAB_0015ef1c;
        }
        _ptr_id = *(CallInst **)&pRVar41->declaration;
        uStack_1030._4_4_ = loaded_id;
        uStack_1030._0_4_ = (pRVar41->declaration).vecsize;
        if (raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ::_M_realloc_insert<dxil_spv::Converter::Impl::RawDeclarationVariable>
                    (&raw_declarations,
                     (iterator)
                     raw_declarations.
                     super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(RawDeclarationVariable *)&ptr_id);
        }
        else {
          *(CallInst **)
           &(raw_declarations.
             super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
             ._M_impl.super__Vector_impl_data._M_finish)->declaration = _ptr_id;
          *(undefined8 *)
           &((raw_declarations.
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_finish)->declaration).vecsize = uStack_1030;
          raw_declarations.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               raw_declarations.
               super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pRVar41 = pRVar41 + 1;
      } while (pRVar41 != pRVar4);
    }
    pmVar30 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)pUVar1,&resource_id);
    if (local_1098 == ~StorageClassUniformConstant) {
      _ptr_id = instruction;
      pmVar29 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
      IVar20 = pmVar29->offset_buffer_id;
    }
    else {
      IVar20 = (impl->srv_index_to_offset).
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start[local_1098];
    }
    if (IVar20 == 0) {
      resource_id_1 = 0;
    }
    else {
      resource_id_1 =
           build_load_buffer_offset(impl,pRVar38,pmVar30,IVar20,resource_id_1,SUB41(local_10a0,0));
    }
    pmVar31 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)pUVar1,&loaded_id);
    CVar5 = pmVar30->component_type;
    uVar6 = *(undefined2 *)&pmVar30->field_0x2;
    RVar7 = pmVar30->raw_component_vecsize;
    uVar22 = pmVar30->stride;
    IVar20 = pmVar30->var_id;
    pmVar31->kind = pmVar30->kind;
    pmVar31->component_type = CVar5;
    *(undefined2 *)&pmVar31->field_0x2 = uVar6;
    pmVar31->raw_component_vecsize = RVar7;
    pmVar31->stride = uVar22;
    pmVar31->var_id = IVar20;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::operator=(&pmVar31->var_alias_group,&pmVar30->var_alias_group);
    bVar18 = pmVar30->non_uniform;
    bVar19 = pmVar30->counter_is_physical_pointer;
    bVar8 = pmVar30->rov;
    SVar21 = pmVar30->storage;
    IVar20 = pmVar30->counter_var_id;
    bVar9 = (pmVar30->physical_pointer_meta).nonwritable;
    bVar10 = (pmVar30->physical_pointer_meta).nonreadable;
    bVar11 = (pmVar30->physical_pointer_meta).coherent;
    bVar12 = (pmVar30->physical_pointer_meta).rov;
    uVar13 = (pmVar30->physical_pointer_meta).stride;
    uVar14 = *(undefined3 *)&(pmVar30->physical_pointer_meta).field_0x5;
    uVar15 = (pmVar30->physical_pointer_meta).size;
    IVar24 = pmVar30->index_offset_id;
    IVar25 = (pmVar30->instrumentation).bda_id;
    pmVar31->aliased = pmVar30->aliased;
    pmVar31->non_uniform = bVar18;
    pmVar31->counter_is_physical_pointer = bVar19;
    pmVar31->rov = bVar8;
    pmVar31->storage = SVar21;
    pmVar31->counter_var_id = IVar20;
    (pmVar31->physical_pointer_meta).nonwritable = bVar9;
    (pmVar31->physical_pointer_meta).nonreadable = bVar10;
    (pmVar31->physical_pointer_meta).coherent = bVar11;
    (pmVar31->physical_pointer_meta).rov = bVar12;
    (pmVar31->physical_pointer_meta).stride = uVar13;
    *(undefined3 *)&(pmVar31->physical_pointer_meta).field_0x5 = uVar14;
    (pmVar31->physical_pointer_meta).size = uVar15;
    pmVar31->index_offset_id = IVar24;
    (pmVar31->instrumentation).bda_id = IVar25;
    IVar20 = (pmVar30->instrumentation).resource_size_id;
    (pmVar31->instrumentation).elem_size_id = (pmVar30->instrumentation).elem_size_id;
    (pmVar31->instrumentation).resource_size_id = IVar20;
    bVar18 = is_non_uniform;
    pmVar31->non_uniform = is_non_uniform;
    pmVar31->index_offset_id = resource_id_1;
    pRVar41 = (pmVar31->var_alias_group).
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_start;
    (pmVar31->var_alias_group).
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start =
         raw_declarations.
         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pmVar31->var_alias_group).
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         raw_declarations.
         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pmVar31->var_alias_group).
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         raw_declarations.
         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pRVar41 != (pointer)0x0) {
      free_in_thread(pRVar41);
    }
    pmVar31->aliased = pRVar38->aliased;
    (pmVar31->physical_pointer_meta).nonwritable = true;
    (pmVar31->instrumentation).resource_size_id = instrumentation.resource_size_id;
    (pmVar31->instrumentation).bda_id = instrumentation.bda_id;
    (pmVar31->instrumentation).elem_size_id = instrumentation.elem_size_id;
    if (pRVar38->bindless == true) {
      pmVar31->stride = pRVar38->stride;
    }
    if (bVar18 == false) goto LAB_0015f273;
    IVar20 = spv::Builder::getDerefTypeId(pBVar27,resource_id);
    IVar20 = spv::Builder::getContainedTypeId(pBVar27,IVar20);
    if ((pBVar27->module).idToInstruction.
        super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>.
        _M_impl.super__Vector_impl_data._M_start[IVar20]->opCode != OpTypeAccelerationStructureKHR)
    {
      if (pmVar31->storage == StorageClassStorageBuffer) {
        _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bc);
      }
      else {
        DVar26 = spv::Builder::getTypeDimensionality(pBVar27,IVar20);
        if (DVar26 == DimBuffer) {
          _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bf);
        }
        else {
          _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bb);
        }
      }
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar27->capabilities,&ptr_id);
    }
    break;
  case 1:
    if ((impl->ags).uav_magic_resource_type_index == resource_range) {
      IVar20 = (impl->ags).magic_ptr_id;
      if (IVar20 == 0) {
        IVar20 = SPIRVModule::allocate_id(impl->spirv_module);
        (impl->ags).magic_ptr_id = IVar20;
      }
      goto LAB_0015e026;
    }
    if (resource_range == 0xffffffff) {
      _ptr_id = instruction;
      pmVar29 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
      pRVar38 = &pmVar29->reference;
    }
    else {
      pRVar38 = (impl->uav_index_to_reference).
                super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                ._M_impl.super__Vector_impl_data._M_start + resource_range;
    }
    if ((long)pRVar38->local_root_signature_entry < 0) {
      if ((pRVar38->root_descriptor & 1U) != 0) goto LAB_0015e5ae;
    }
    else if ((impl->local_root_signature).
             super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
             ._M_impl.super__Vector_impl_data._M_start[pRVar38->local_root_signature_entry].type ==
             Descriptor) {
LAB_0015e5ae:
      IVar20 = build_root_descriptor_load_physical_pointer(impl,pRVar38);
      _ptr_id = (CallInst *)CONCAT44(RStack_1034,IVar20);
      Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar20);
      pmVar30 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&ptr_id);
      pmVar30->kind = Invalid;
      pmVar30->component_type = Invalid;
      pmVar30->raw_component_vecsize = V1;
      pmVar30->stride = 0;
      pmVar30->var_id = 0;
      pRVar41 = (pmVar30->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (pmVar30->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pmVar30->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pmVar30->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (pRVar41 != (pointer)0x0) {
        free_in_thread(pRVar41);
      }
      pmVar30->aliased = false;
      pmVar30->non_uniform = false;
      pmVar30->counter_is_physical_pointer = false;
      pmVar30->rov = false;
      pmVar30->storage = StorageClassUniformConstant;
      pmVar30->counter_var_id = 0;
      (pmVar30->physical_pointer_meta).nonwritable = false;
      (pmVar30->physical_pointer_meta).nonreadable = false;
      (pmVar30->physical_pointer_meta).coherent = false;
      (pmVar30->physical_pointer_meta).rov = false;
      (pmVar30->physical_pointer_meta).stride = '\0';
      *(undefined8 *)&(pmVar30->physical_pointer_meta).size = 0;
      (pmVar30->instrumentation).bda_id = 0;
      (pmVar30->instrumentation).elem_size_id = 0;
      (pmVar30->instrumentation).resource_size_id = 0;
      pmVar30->stride = pRVar38->stride;
      pmVar30->storage = StorageClassPhysicalStorageBuffer;
      (pmVar30->physical_pointer_meta).coherent = pRVar38->coherent;
      bVar18 = pRVar38->rov;
      (pmVar30->physical_pointer_meta).rov = bVar18;
      pmVar30->kind = pRVar38->resource_kind;
      pmVar30->rov = bVar18;
      return true;
    }
    is_non_uniform_3 = false;
    IVar20 = pRVar38->var_id;
    if (IVar20 == 0) {
      pRVar41 = (pRVar38->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pRVar41 ==
          (pRVar38->var_alias_group).
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        IVar20 = 0;
      }
      else {
        IVar20 = pRVar41->var_id;
      }
    }
    _ptr_id = (CallInst *)CONCAT44(RStack_1034,IVar20);
    pUVar1 = &impl->handle_to_resource_meta;
    iVar35 = std::
             _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&pUVar1->_M_h,&ptr_id);
    if ((iVar35.
         super__Node_iterator_base<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_false>
         ._M_cur == (__node_type *)0x0) ||
       (DVar23 = DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT,
       *(int *)((long)iVar35.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_false>
                      ._M_cur + 0x3c) != 0xc)) {
      DVar23 = DESCRIPTOR_QA_TYPE_STORAGE_IMAGE_BIT;
      if ((byte)(pRVar38->resource_kind - TypedBuffer) < 4) {
        DVar23 = DESCRIPTOR_QA_TYPE_STORAGE_TEXEL_BUFFER_BIT;
      }
    }
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    loaded_id = 0;
    resource_id_1 = 0;
    resource_id = 0;
    _is_non_uniform = 0;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::reserve(&raw_declarations,
              (long)(pRVar38->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pRVar38->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
    instrumentation.resource_size_id = 0;
    instrumentation.bda_id = 0;
    instrumentation.elem_size_id = 0;
    IVar20 = pRVar38->var_id;
    if (IVar20 == 0) {
LAB_0015edc6:
      pRVar41 = (pRVar38->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar4 = (pRVar38->var_alias_group).
               super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pRVar41 != pRVar4) {
        bVar18 = local_10a0._0_1_;
        do {
          resource_id = pRVar41->var_id;
          bVar19 = build_load_resource_handle
                             (impl,resource_id,pRVar38,DVar23,instruction,instruction_offset,bVar18,
                              &is_non_uniform_3,(Id *)0x0,&loaded_id,&resource_id_1,&instrumentation
                             );
          if (!bVar19) {
            p_Var32 = get_thread_log_callback();
            if (p_Var32 != (LoggingCallback)0x0) goto LAB_0015eeda;
            emit_create_handle();
            goto LAB_0015ef1c;
          }
          _ptr_id = *(CallInst **)&pRVar41->declaration;
          uStack_1030._4_4_ = loaded_id;
          uStack_1030._0_4_ = (pRVar41->declaration).vecsize;
          if (raw_declarations.
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              raw_declarations.
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ::_M_realloc_insert<dxil_spv::Converter::Impl::RawDeclarationVariable>
                      (&raw_declarations,
                       (iterator)
                       raw_declarations.
                       super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(RawDeclarationVariable *)&ptr_id)
            ;
          }
          else {
            *(CallInst **)
             &(raw_declarations.
               super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
               ._M_impl.super__Vector_impl_data._M_finish)->declaration = _ptr_id;
            *(undefined8 *)
             &((raw_declarations.
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_finish)->declaration).vecsize = uStack_1030;
            raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 raw_declarations.
                 super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pRVar41 = pRVar41 + 1;
        } while (pRVar41 != pRVar4);
      }
      pmVar30 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)pUVar1,&resource_id);
      if (local_1098 == ~StorageClassUniformConstant) {
        _ptr_id = instruction;
        pmVar29 = std::__detail::
                  _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
        uVar22 = pmVar29->offset_buffer_id;
      }
      else {
        uVar22 = (impl->uav_index_to_offset).
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[local_1098];
      }
      instruction_00 = (CallInst *)(ulong)uVar22;
      if (uVar22 == 0) {
        resource_id_1 = 0;
      }
      else {
        resource_id_1 =
             build_load_buffer_offset(impl,pRVar38,pmVar30,uVar22,resource_id_1,SUB41(local_10a0,0))
        ;
      }
      pmVar31 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)pUVar1,&loaded_id);
      CVar5 = pmVar30->component_type;
      uVar6 = *(undefined2 *)&pmVar30->field_0x2;
      RVar7 = pmVar30->raw_component_vecsize;
      uVar22 = pmVar30->stride;
      IVar20 = pmVar30->var_id;
      pmVar31->kind = pmVar30->kind;
      pmVar31->component_type = CVar5;
      *(undefined2 *)&pmVar31->field_0x2 = uVar6;
      pmVar31->raw_component_vecsize = RVar7;
      pmVar31->stride = uVar22;
      pmVar31->var_id = IVar20;
      std::
      vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::operator=(&pmVar31->var_alias_group,&pmVar30->var_alias_group);
      bVar16 = is_non_uniform_3;
      bVar18 = pmVar30->non_uniform;
      bVar19 = pmVar30->counter_is_physical_pointer;
      bVar8 = pmVar30->rov;
      SVar21 = pmVar30->storage;
      IVar20 = pmVar30->counter_var_id;
      bVar9 = (pmVar30->physical_pointer_meta).nonwritable;
      bVar10 = (pmVar30->physical_pointer_meta).nonreadable;
      bVar11 = (pmVar30->physical_pointer_meta).coherent;
      bVar12 = (pmVar30->physical_pointer_meta).rov;
      uVar13 = (pmVar30->physical_pointer_meta).stride;
      uVar14 = *(undefined3 *)&(pmVar30->physical_pointer_meta).field_0x5;
      uVar15 = (pmVar30->physical_pointer_meta).size;
      IVar24 = pmVar30->index_offset_id;
      IVar25 = (pmVar30->instrumentation).bda_id;
      pmVar31->aliased = pmVar30->aliased;
      pmVar31->non_uniform = bVar18;
      pmVar31->counter_is_physical_pointer = bVar19;
      pmVar31->rov = bVar8;
      pmVar31->storage = SVar21;
      pmVar31->counter_var_id = IVar20;
      (pmVar31->physical_pointer_meta).nonwritable = bVar9;
      (pmVar31->physical_pointer_meta).nonreadable = bVar10;
      (pmVar31->physical_pointer_meta).coherent = bVar11;
      (pmVar31->physical_pointer_meta).rov = bVar12;
      (pmVar31->physical_pointer_meta).stride = uVar13;
      *(undefined3 *)&(pmVar31->physical_pointer_meta).field_0x5 = uVar14;
      (pmVar31->physical_pointer_meta).size = uVar15;
      pmVar31->index_offset_id = IVar24;
      (pmVar31->instrumentation).bda_id = IVar25;
      IVar20 = (pmVar30->instrumentation).resource_size_id;
      (pmVar31->instrumentation).elem_size_id = (pmVar30->instrumentation).elem_size_id;
      (pmVar31->instrumentation).resource_size_id = IVar20;
      pmVar31->non_uniform = is_non_uniform_3;
      pmVar31->index_offset_id = resource_id_1;
      pRVar41 = (pmVar31->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start =
           raw_declarations.
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           raw_declarations.
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pmVar31->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           raw_declarations.
           super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pRVar41 != (pointer)0x0) {
        free_in_thread(pRVar41);
      }
      pmVar31->aliased = pRVar38->aliased;
      pmVar31->rov = pRVar38->rov;
      (pmVar31->physical_pointer_meta).coherent = pRVar38->coherent;
      (pmVar31->instrumentation).bda_id = instrumentation.bda_id;
      (pmVar31->instrumentation).elem_size_id = instrumentation.elem_size_id;
      (pmVar31->instrumentation).resource_size_id = instrumentation.resource_size_id;
      pmVar31->var_id = _is_non_uniform;
      if (pRVar38->bindless == true) {
        pmVar31->stride = pRVar38->stride;
      }
      if (bVar16 != false) {
        IVar20 = spv::Builder::getDerefTypeId(pBVar27,resource_id);
        IVar20 = spv::Builder::getContainedTypeId(pBVar27,IVar20);
        if (pmVar31->storage == StorageClassStorageBuffer) {
          _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bc);
        }
        else {
          DVar26 = spv::Builder::getTypeDimensionality(pBVar27,IVar20);
          if (DVar26 == DimBuffer) {
            _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14c0);
          }
          else {
            _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bd);
          }
        }
        std::
        _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
        ::_M_insert_unique<spv::Capability_const&>
                  ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                    *)&pBVar27->capabilities,&ptr_id);
        spv::Builder::addExtension(pBVar27,"SPV_EXT_descriptor_indexing");
      }
      _ptr_id = instruction;
      cVar37 = std::
               _Hashtable<const_LLVMBC::Value_*,_const_LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>,_std::__detail::_Identity,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&(impl->llvm_values_using_update_counter)._M_h,(key_type *)&ptr_id);
      uVar17 = local_10a0;
      if (cVar37.super__Node_iterator_base<const_LLVMBC::Value_*,_false>._M_cur ==
          (__node_type *)0x0) goto LAB_0015f273;
      if (local_1098 == ~StorageClassUniformConstant) {
        _ptr_id = instruction;
        pmVar29 = std::__detail::
                  _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
        counter = &pmVar29->counter_reference;
      }
      else {
        counter = (impl->uav_index_to_counter).
                  super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_1098;
      }
      if (counter->bindless != true) {
        pmVar31->counter_var_id = counter->var_id;
LAB_0015f1b7:
        pmVar31->counter_is_physical_pointer = false;
        goto LAB_0015f273;
      }
      if (counter->resource_kind == RawBuffer) {
        IVar20 = build_load_physical_pointer(impl,counter,instruction_offset,instruction_00);
        pmVar31->counter_var_id = IVar20;
        pmVar31->counter_is_physical_pointer = true;
        (pmVar31->instrumentation).bda_id = 0;
        (pmVar31->instrumentation).elem_size_id = 0;
        (pmVar31->instrumentation).resource_size_id = 0;
        goto LAB_0015f273;
      }
      bVar18 = build_load_resource_handle
                         (impl,counter->var_id,pRVar38,DESCRIPTOR_QA_TYPE_RAW_VA_BIT,instruction,
                          instruction_offset,SUB41(uVar17,0),&is_non_uniform_3,
                          &pmVar31->counter_var_id,(Id *)0x0,(Id *)0x0,
                          (ResourceMetaInstrumentation *)0x0);
      if (bVar18) goto LAB_0015f1b7;
      p_Var32 = get_thread_log_callback();
      if (p_Var32 == (LoggingCallback)0x0) {
        emit_create_handle();
        goto LAB_0015ef1c;
      }
      acStack_1028[0] = 'A';
      acStack_1028[1] = 'V';
      acStack_1028[2] = ' ';
      acStack_1028[3] = 'c';
      acStack_1028[4] = 'o';
      acStack_1028[5] = 'u';
      acStack_1028[6] = 'n';
      acStack_1028[7] = 't';
      builtin_strncpy(acStack_1028 + 8,"er po",5);
      uStack_1030 = 0x552064616f6c206f;
      uVar36 = 0xa2e7265746e69;
LAB_0015ef06:
      _ptr_id = (CallInst *)0x742064656c696146;
      uStack_101b = (undefined4)uVar36;
      uStack_1017 = (undefined4)((ulong)uVar36 >> 0x20);
      pvVar33 = get_thread_log_callback_userdata();
      (*p_Var32)(pvVar33,Error,(char *)&ptr_id);
    }
    else {
      resource_id = IVar20;
      bVar18 = build_load_resource_handle
                         (impl,IVar20,pRVar38,DVar23,instruction,instruction_offset,local_10a0._0_1_
                          ,&is_non_uniform_3,(Id *)&is_non_uniform,&loaded_id,&resource_id_1,
                          &instrumentation);
      if (bVar18) goto LAB_0015edc6;
      p_Var32 = get_thread_log_callback();
      if (p_Var32 != (LoggingCallback)0x0) {
LAB_0015eeda:
        builtin_strncpy(acStack_1028,"AV resou",8);
        uStack_1030._4_1_ = 'a';
        uStack_1030._5_1_ = 'd';
        uStack_1030._6_1_ = ' ';
        uStack_1030._7_1_ = 'U';
        goto LAB_0015eef8;
      }
      emit_create_handle();
    }
LAB_0015ef1c:
    if (raw_declarations.
        super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      free_in_thread(raw_declarations.
                     super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
LAB_0015f284:
    return false;
  case 2:
    if (resource_range == 0xffffffff) {
      _ptr_id = instruction;
      pmVar29 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
      pRVar38 = &pmVar29->reference;
    }
    else {
      pRVar38 = (impl->cbv_index_to_reference).
                super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                ._M_impl.super__Vector_impl_data._M_start + resource_range;
    }
    lVar40 = (long)pRVar38->local_root_signature_entry;
    if (lVar40 < 0) {
      if ((pRVar38->root_descriptor & 1U) == 0) {
        IVar20 = pRVar38->var_id;
        if ((IVar20 != 0) && (IVar20 == impl->root_constant_id)) goto LAB_0015e2cd;
        goto LAB_0015e2fd;
      }
LAB_0015df8b:
      IVar20 = build_root_descriptor_load_physical_pointer(impl,pRVar38);
      _ptr_id = (CallInst *)CONCAT44(RStack_1034,IVar20);
      pmVar30 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&ptr_id);
      pmVar30->kind = Invalid;
      pmVar30->component_type = Invalid;
      pmVar30->raw_component_vecsize = V1;
      pmVar30->stride = 0;
      pmVar30->var_id = 0;
      pRVar41 = (pmVar30->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (pmVar30->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pmVar30->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pmVar30->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (pRVar41 != (pointer)0x0) {
        free_in_thread(pRVar41);
      }
      pmVar30->aliased = false;
      pmVar30->non_uniform = false;
      pmVar30->counter_is_physical_pointer = false;
      pmVar30->rov = false;
      pmVar30->storage = StorageClassUniformConstant;
      pmVar30->counter_var_id = 0;
      (pmVar30->physical_pointer_meta).nonwritable = false;
      (pmVar30->physical_pointer_meta).nonreadable = false;
      (pmVar30->physical_pointer_meta).coherent = false;
      (pmVar30->physical_pointer_meta).rov = false;
      (pmVar30->physical_pointer_meta).stride = '\0';
      *(undefined8 *)&(pmVar30->physical_pointer_meta).size = 0;
      (pmVar30->instrumentation).bda_id = 0;
      (pmVar30->instrumentation).elem_size_id = 0;
      (pmVar30->instrumentation).resource_size_id = 0;
      pmVar30->stride = pRVar38->stride;
      pmVar30->storage = StorageClassPhysicalStorageBuffer;
      (pmVar30->physical_pointer_meta).nonwritable = true;
      pmVar30->kind = pRVar38->resource_kind;
      IVar20 = ptr_id;
LAB_0015e026:
      Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar20);
      return true;
    }
    pLVar3 = (impl->local_root_signature).
             super__Vector_base<dxil_spv::LocalRootSignatureEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::LocalRootSignatureEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pLVar3[lVar40].type == Descriptor) goto LAB_0015df8b;
    IVar20 = pRVar38->var_id;
    if ((IVar20 != 0) && (IVar20 == impl->root_constant_id)) {
LAB_0015e2cd:
      Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar20);
      mVar2 = pRVar38->push_constant_member;
      _ptr_id = instruction;
      pmVar28 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_root_member_offset,(key_type *)&ptr_id);
      *pmVar28 = mVar2;
      return true;
    }
    if (pLVar3[lVar40].type == Constants) {
      IVar20 = build_shader_record_access_chain(impl,pRVar38->local_root_signature_entry);
      raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(raw_declarations.
                             super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,IVar20);
      pmVar30 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,(key_type *)&raw_declarations);
      pmVar30->kind = Invalid;
      pmVar30->component_type = Invalid;
      pmVar30->raw_component_vecsize = V1;
      pmVar30->stride = 0;
      pmVar30->var_id = 0;
      pRVar41 = (pmVar30->var_alias_group).
                super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (pmVar30->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pmVar30->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pmVar30->var_alias_group).
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      if (pRVar41 != (pointer)0x0) {
        free_in_thread(pRVar41);
      }
      pmVar30->aliased = false;
      pmVar30->non_uniform = false;
      pmVar30->counter_is_physical_pointer = false;
      pmVar30->rov = false;
      pmVar30->storage = StorageClassUniformConstant;
      pmVar30->counter_var_id = 0;
      (pmVar30->physical_pointer_meta).nonwritable = false;
      (pmVar30->physical_pointer_meta).nonreadable = false;
      (pmVar30->physical_pointer_meta).coherent = false;
      (pmVar30->physical_pointer_meta).rov = false;
      (pmVar30->physical_pointer_meta).stride = '\0';
      *(undefined8 *)&(pmVar30->physical_pointer_meta).size = 0;
      (pmVar30->instrumentation).bda_id = 0;
      (pmVar30->instrumentation).elem_size_id = 0;
      (pmVar30->instrumentation).resource_size_id = 0;
      pmVar30->storage = StorageClassShaderRecordBufferKHR;
      pmVar30->kind = CBuffer;
      mVar2 = pRVar38->local_root_signature_entry;
      _ptr_id = instruction;
      pmVar28 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_root_member_offset,(key_type *)&ptr_id);
      *pmVar28 = mVar2;
      IVar20 = (Id)raw_declarations.
                   super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      goto LAB_0015e026;
    }
LAB_0015e2fd:
    resource_id = resource_id & 0xffffff00;
    bVar39 = (impl->options).bindless_cbv_ssbo_emulation & pRVar38->bindless;
    local_1098 = StorageClassUniform;
    if (bVar39 != 0) {
      local_1098 = StorageClassStorageBuffer;
    }
    DVar23 = (uint)bVar39 * 4 + DESCRIPTOR_QA_TYPE_UNIFORM_BUFFER_BIT;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    loaded_id = 0;
    resource_id_1 = 0;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::reserve(&raw_declarations,
              (long)(pRVar38->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(pRVar38->var_alias_group).
                    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4);
    instrumentation.resource_size_id = 0;
    instrumentation.bda_id = 0;
    instrumentation.elem_size_id = 0;
    IVar20 = pRVar38->var_id;
    if (IVar20 != 0) {
      resource_id_1 = IVar20;
      bVar18 = build_load_resource_handle
                         (impl,IVar20,pRVar38,DVar23,instruction,instruction_offset,local_10a0._0_1_
                          ,(bool *)&resource_id,(Id *)0x0,&loaded_id,(Id *)0x0,&instrumentation);
      if (!bVar18) {
        p_Var32 = get_thread_log_callback();
        if (p_Var32 != (LoggingCallback)0x0) {
LAB_0015ecb9:
          builtin_strncpy(acStack_1028,"BV resou",8);
          uStack_1030._4_1_ = 'a';
          uStack_1030._5_1_ = 'd';
          uStack_1030._6_1_ = ' ';
          uStack_1030._7_1_ = 'C';
          goto LAB_0015eef8;
        }
        emit_create_handle();
        goto LAB_0015ef1c;
      }
    }
    pRVar41 = (pRVar38->var_alias_group).
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar4 = (pRVar38->var_alias_group).
             super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar41 != pRVar4) {
      bVar18 = local_10a0._0_1_;
      do {
        resource_id_1 = pRVar41->var_id;
        bVar19 = build_load_resource_handle
                           (impl,resource_id_1,pRVar38,DVar23,instruction,instruction_offset,bVar18,
                            (bool *)&resource_id,(Id *)0x0,&loaded_id,(Id *)0x0,&instrumentation);
        if (!bVar19) {
          p_Var32 = get_thread_log_callback();
          if (p_Var32 != (LoggingCallback)0x0) goto LAB_0015ecb9;
          emit_create_handle();
          goto LAB_0015ef1c;
        }
        _ptr_id = *(CallInst **)&pRVar41->declaration;
        uStack_1030._4_4_ = loaded_id;
        uStack_1030._0_4_ = (pRVar41->declaration).vecsize;
        if (raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            raw_declarations.
            super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ::_M_realloc_insert<dxil_spv::Converter::Impl::RawDeclarationVariable>
                    (&raw_declarations,
                     (iterator)
                     raw_declarations.
                     super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                     ._M_impl.super__Vector_impl_data._M_finish,(RawDeclarationVariable *)&ptr_id);
        }
        else {
          *(CallInst **)
           &(raw_declarations.
             super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
             ._M_impl.super__Vector_impl_data._M_finish)->declaration = _ptr_id;
          *(undefined8 *)
           &((raw_declarations.
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_finish)->declaration).vecsize = uStack_1030;
          raw_declarations.
          super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               raw_declarations.
               super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pRVar41 = pRVar41 + 1;
      } while (pRVar41 != pRVar4);
    }
    pmVar30 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->handle_to_resource_meta,&resource_id_1);
    pmVar31 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&impl->handle_to_resource_meta,&loaded_id);
    CVar5 = pmVar30->component_type;
    uVar6 = *(undefined2 *)&pmVar30->field_0x2;
    RVar7 = pmVar30->raw_component_vecsize;
    uVar22 = pmVar30->stride;
    IVar20 = pmVar30->var_id;
    pmVar31->kind = pmVar30->kind;
    pmVar31->component_type = CVar5;
    *(undefined2 *)&pmVar31->field_0x2 = uVar6;
    pmVar31->raw_component_vecsize = RVar7;
    pmVar31->stride = uVar22;
    pmVar31->var_id = IVar20;
    std::
    vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ::operator=(&pmVar31->var_alias_group,&pmVar30->var_alias_group);
    bVar18 = pmVar30->non_uniform;
    bVar19 = pmVar30->counter_is_physical_pointer;
    bVar8 = pmVar30->rov;
    SVar21 = pmVar30->storage;
    IVar20 = pmVar30->counter_var_id;
    bVar9 = (pmVar30->physical_pointer_meta).nonwritable;
    bVar10 = (pmVar30->physical_pointer_meta).nonreadable;
    bVar11 = (pmVar30->physical_pointer_meta).coherent;
    bVar12 = (pmVar30->physical_pointer_meta).rov;
    uVar13 = (pmVar30->physical_pointer_meta).stride;
    uVar14 = *(undefined3 *)&(pmVar30->physical_pointer_meta).field_0x5;
    uVar15 = (pmVar30->physical_pointer_meta).size;
    IVar24 = pmVar30->index_offset_id;
    IVar25 = (pmVar30->instrumentation).bda_id;
    pmVar31->aliased = pmVar30->aliased;
    pmVar31->non_uniform = bVar18;
    pmVar31->counter_is_physical_pointer = bVar19;
    pmVar31->rov = bVar8;
    pmVar31->storage = SVar21;
    pmVar31->counter_var_id = IVar20;
    (pmVar31->physical_pointer_meta).nonwritable = bVar9;
    (pmVar31->physical_pointer_meta).nonreadable = bVar10;
    (pmVar31->physical_pointer_meta).coherent = bVar11;
    (pmVar31->physical_pointer_meta).rov = bVar12;
    (pmVar31->physical_pointer_meta).stride = uVar13;
    *(undefined3 *)&(pmVar31->physical_pointer_meta).field_0x5 = uVar14;
    (pmVar31->physical_pointer_meta).size = uVar15;
    pmVar31->index_offset_id = IVar24;
    (pmVar31->instrumentation).bda_id = IVar25;
    IVar20 = (pmVar30->instrumentation).resource_size_id;
    (pmVar31->instrumentation).elem_size_id = (pmVar30->instrumentation).elem_size_id;
    (pmVar31->instrumentation).resource_size_id = IVar20;
    bVar18 = resource_id._0_1_;
    pmVar31->non_uniform = resource_id._0_1_;
    pmVar31->storage = local_1098;
    pRVar41 = (pmVar31->var_alias_group).
              super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
              ._M_impl.super__Vector_impl_data._M_start;
    (pmVar31->var_alias_group).
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start =
         raw_declarations.
         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (pmVar31->var_alias_group).
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         raw_declarations.
         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (pmVar31->var_alias_group).
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         raw_declarations.
         super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pRVar41 != (pointer)0x0) {
      free_in_thread(pRVar41);
    }
    pmVar31->kind = CBuffer;
    (pmVar31->instrumentation).bda_id = instrumentation.bda_id;
    (pmVar31->instrumentation).elem_size_id = instrumentation.elem_size_id;
    (pmVar31->instrumentation).resource_size_id = instrumentation.resource_size_id;
    if (bVar18 == false) goto LAB_0015f273;
    if (bVar39 == 0) {
      _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14ba);
    }
    else {
      _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bc);
    }
    std::
    _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
    ::_M_insert_unique<spv::Capability_const&>
              ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                *)&pBVar27->capabilities,&ptr_id);
    break;
  case 3:
    if (resource_range == 0xffffffff) {
      _ptr_id = instruction;
      pmVar29 = std::__detail::
                _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->llvm_annotate_handle_uses,(key_type *)&ptr_id);
      pRVar38 = &pmVar29->reference;
    }
    else {
      pRVar38 = (impl->sampler_index_to_reference).
                super__Vector_base<dxil_spv::Converter::Impl::ResourceReference,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ResourceReference>_>
                ._M_impl.super__Vector_impl_data._M_start + resource_range;
    }
    raw_declarations.
    super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(raw_declarations.
                           super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                           ._M_impl.super__Vector_impl_data._M_start._4_4_,pRVar38->var_id);
    loaded_id = loaded_id & 0xffffff00;
    instrumentation._0_8_ = (ulong)instrumentation.elem_size_id << 0x20;
    bVar18 = build_load_resource_handle
                       (impl,pRVar38->var_id,pRVar38,DESCRIPTOR_QA_TYPE_SAMPLER_BIT,instruction,
                        instruction_offset,non_uniform,(bool *)&loaded_id,(Id *)0x0,
                        &instrumentation.bda_id,(Id *)0x0,(ResourceMetaInstrumentation *)0x0);
    if (bVar18) {
      pmVar30 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,&instrumentation.bda_id);
      pmVar31 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&impl->handle_to_resource_meta,(key_type *)&raw_declarations);
      CVar5 = pmVar31->component_type;
      uVar6 = *(undefined2 *)&pmVar31->field_0x2;
      RVar7 = pmVar31->raw_component_vecsize;
      uVar22 = pmVar31->stride;
      IVar20 = pmVar31->var_id;
      pmVar30->kind = pmVar31->kind;
      pmVar30->component_type = CVar5;
      *(undefined2 *)&pmVar30->field_0x2 = uVar6;
      pmVar30->raw_component_vecsize = RVar7;
      pmVar30->stride = uVar22;
      pmVar30->var_id = IVar20;
      std::
      vector<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ::operator=(&pmVar30->var_alias_group,&pmVar31->var_alias_group);
      bVar18 = pmVar31->non_uniform;
      bVar19 = pmVar31->counter_is_physical_pointer;
      bVar8 = pmVar31->rov;
      SVar21 = pmVar31->storage;
      IVar20 = pmVar31->counter_var_id;
      bVar9 = (pmVar31->physical_pointer_meta).nonwritable;
      bVar10 = (pmVar31->physical_pointer_meta).nonreadable;
      bVar11 = (pmVar31->physical_pointer_meta).coherent;
      bVar12 = (pmVar31->physical_pointer_meta).rov;
      uVar13 = (pmVar31->physical_pointer_meta).stride;
      uVar14 = *(undefined3 *)&(pmVar31->physical_pointer_meta).field_0x5;
      uVar15 = (pmVar31->physical_pointer_meta).size;
      IVar24 = pmVar31->index_offset_id;
      IVar25 = (pmVar31->instrumentation).bda_id;
      pmVar30->aliased = pmVar31->aliased;
      pmVar30->non_uniform = bVar18;
      pmVar30->counter_is_physical_pointer = bVar19;
      pmVar30->rov = bVar8;
      pmVar30->storage = SVar21;
      pmVar30->counter_var_id = IVar20;
      (pmVar30->physical_pointer_meta).nonwritable = bVar9;
      (pmVar30->physical_pointer_meta).nonreadable = bVar10;
      (pmVar30->physical_pointer_meta).coherent = bVar11;
      (pmVar30->physical_pointer_meta).rov = bVar12;
      (pmVar30->physical_pointer_meta).stride = uVar13;
      *(undefined3 *)&(pmVar30->physical_pointer_meta).field_0x5 = uVar14;
      (pmVar30->physical_pointer_meta).size = uVar15;
      pmVar30->index_offset_id = IVar24;
      (pmVar30->instrumentation).bda_id = IVar25;
      IVar20 = (pmVar31->instrumentation).resource_size_id;
      (pmVar30->instrumentation).elem_size_id = (pmVar31->instrumentation).elem_size_id;
      (pmVar30->instrumentation).resource_size_id = IVar20;
      pmVar30->non_uniform = loaded_id._0_1_;
      if (loaded_id._0_1_ != true) {
        return true;
      }
      _ptr_id = (CallInst *)CONCAT44(RStack_1034,0x14bb);
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&pBVar27->capabilities,&ptr_id);
      spv::Builder::addExtension(pBVar27,"SPV_EXT_descriptor_indexing");
      return true;
    }
    p_Var32 = get_thread_log_callback();
    if (p_Var32 != (LoggingCallback)0x0) {
      uStack_1017 = 0x6c646e61;
      uStack_1013 = 0xa2e65;
      builtin_strncpy(acStack_1028,"ampler resour",0xd);
      uStack_101b = 0x68206563;
      _ptr_id = (CallInst *)0x742064656c696146;
      uStack_1030 = 0x532064616f6c206f;
      pvVar33 = get_thread_log_callback_userdata();
      (*p_Var32)(pvVar33,Error,(char *)&ptr_id);
      return false;
    }
    emit_create_handle();
    return false;
  default:
    goto LAB_0015f284;
  }
  spv::Builder::addExtension(pBVar27,"SPV_EXT_descriptor_indexing");
LAB_0015f273:
  if (raw_declarations.
      super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
      ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
    return true;
  }
  free_in_thread(raw_declarations.
                 super__Vector_base<dxil_spv::Converter::Impl::RawDeclarationVariable,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::RawDeclarationVariable>_>
                 ._M_impl.super__Vector_impl_data._M_start);
  return true;
}

Assistant:

static bool emit_create_handle(Converter::Impl &impl, const llvm::CallInst *instruction,
                               DXIL::ResourceType resource_type, unsigned resource_range,
                               llvm::Value *instruction_offset, bool non_uniform)
{
	auto &builder = impl.builder();
	switch (resource_type)
	{
	case DXIL::ResourceType::SRV:
	{
		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);

		if (resource_is_physical_rtas(impl, reference))
		{
			spv::Id ptr_id = build_load_physical_rtas(impl, reference, instruction_offset, non_uniform);
			impl.rewrite_value(instruction, ptr_id);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.storage = spv::StorageClassGeneric;
			meta.kind = DXIL::ResourceKind::RTAccelerationStructure;
		}
		else if (resource_is_physical_pointer(impl, reference))
		{
			spv::Id ptr_id = build_root_descriptor_load_physical_pointer(impl, reference);
			impl.rewrite_value(instruction, ptr_id);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.stride = reference.stride;
			meta.storage = spv::StorageClassPhysicalStorageBuffer;
			meta.physical_pointer_meta.nonwritable = true;
			meta.kind = reference.resource_kind;
		}
		else
		{
			bool is_non_uniform = false;

			spv::Id representative_var_id = reference.var_id;
			if (!representative_var_id && !reference.var_alias_group.empty())
				representative_var_id = reference.var_alias_group.front().var_id;
			auto storage = get_resource_storage_class(impl, representative_var_id);

			DescriptorQATypeFlagBits descriptor_type;
			if (storage == spv::StorageClassStorageBuffer)
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
			else if (resource_kind_is_buffer(reference.resource_kind))
				descriptor_type = DESCRIPTOR_QA_TYPE_UNIFORM_TEXEL_BUFFER_BIT;
			else if (reference.resource_kind == DXIL::ResourceKind::RTAccelerationStructure)
				descriptor_type = DESCRIPTOR_QA_TYPE_RT_ACCELERATION_STRUCTURE_BIT;
			else
				descriptor_type = DESCRIPTOR_QA_TYPE_SAMPLED_IMAGE_BIT;

			Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
			spv::Id loaded_id = 0;
			spv::Id offset_id = 0;
			spv::Id resource_id = 0;
			raw_declarations.reserve(reference.var_alias_group.size());

			Converter::Impl::ResourceMetaInstrumentation instrumentation = {};

			if (reference.var_id)
			{
				resource_id = reference.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type, instruction,
												instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load SRV resource handle.\n");
					return false;
				}
			}

			for (auto &alias : reference.var_alias_group)
			{
				resource_id = alias.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type,
												instruction, instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load SRV resource handle.\n");
					return false;
				}

				raw_declarations.push_back({ alias.declaration, loaded_id });
			}

			auto &incoming_meta = impl.handle_to_resource_meta[resource_id];

			spv::Id offset_buffer_id = get_offset_buffer_variable(impl, resource_type, instruction, resource_range);
			if (offset_buffer_id)
			{
				offset_id = build_load_buffer_offset(impl, reference, incoming_meta,
				                                     offset_buffer_id, offset_id, non_uniform);
			}
			else
				offset_id = 0;

			auto &meta = impl.handle_to_resource_meta[loaded_id];
			meta = incoming_meta;
			meta.non_uniform = is_non_uniform;
			meta.index_offset_id = offset_id;
			meta.var_alias_group = std::move(raw_declarations);
			meta.aliased = reference.aliased;
			meta.physical_pointer_meta.nonwritable = true;
			meta.instrumentation = instrumentation;

			// The base array variable does not know what the stride is, promote that state here.
			if (reference.bindless)
				meta.stride = reference.stride;

			if (is_non_uniform)
			{
				spv::Id type_id = builder.getDerefTypeId(resource_id);
				type_id = builder.getContainedTypeId(type_id);

				if (builder.getTypeClass(type_id) != spv::OpTypeAccelerationStructureKHR)
				{
					if (meta.storage == spv::StorageClassStorageBuffer)
						builder.addCapability(spv::CapabilityStorageBufferArrayNonUniformIndexing);
					else if (builder.getTypeDimensionality(type_id) == spv::DimBuffer)
						builder.addCapability(spv::CapabilityUniformTexelBufferArrayNonUniformIndexing);
					else
						builder.addCapability(spv::CapabilitySampledImageArrayNonUniformIndexingEXT);
				}
				builder.addExtension("SPV_EXT_descriptor_indexing");
			}
		}
		break;
	}

	case DXIL::ResourceType::UAV:
	{
		if (resource_range == impl.ags.uav_magic_resource_type_index)
		{
			// Resources tied to constant uints are considered "magic".
			if (impl.ags.magic_ptr_id == 0)
			{
				spv::Id dummy_value = impl.spirv_module.allocate_id();
				impl.ags.magic_ptr_id = dummy_value;
			}

			impl.rewrite_value(instruction, impl.ags.magic_ptr_id);
			break;
		}

		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);

		if (resource_is_physical_pointer(impl, reference))
		{
			spv::Id ptr_id = build_root_descriptor_load_physical_pointer(impl, reference);
			impl.rewrite_value(instruction, ptr_id);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.stride = reference.stride;
			meta.storage = spv::StorageClassPhysicalStorageBuffer;
			meta.physical_pointer_meta.coherent = reference.coherent;
			meta.physical_pointer_meta.rov = reference.rov;
			meta.kind = reference.resource_kind;
			meta.rov = reference.rov;
		}
		else
		{
			bool is_non_uniform = false;

			spv::Id representative_var_id = reference.var_id;
			if (!representative_var_id && !reference.var_alias_group.empty())
				representative_var_id = reference.var_alias_group.front().var_id;
			auto storage = get_resource_storage_class(impl, representative_var_id);

			DescriptorQATypeFlagBits descriptor_type;
			if (storage == spv::StorageClassStorageBuffer)
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT;
			else if (resource_kind_is_buffer(reference.resource_kind))
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_TEXEL_BUFFER_BIT;
			else
				descriptor_type = DESCRIPTOR_QA_TYPE_STORAGE_IMAGE_BIT;

			Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
			spv::Id loaded_id = 0;
			spv::Id offset_id = 0;
			spv::Id resource_id = 0;
			spv::Id resource_ptr_id = 0;
			raw_declarations.reserve(reference.var_alias_group.size());

			Converter::Impl::ResourceMetaInstrumentation instrumentation = {};

			if (reference.var_id)
			{
				resource_id = reference.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type, instruction,
				                                instruction_offset, non_uniform, is_non_uniform, &resource_ptr_id,
				                                &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load UAV resource handle.\n");
					return false;
				}
			}

			for (auto &alias : reference.var_alias_group)
			{
				resource_id = alias.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type,
												instruction, instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, &offset_id, &instrumentation))
				{
					LOGE("Failed to load UAV resource handle.\n");
					return false;
				}

				raw_declarations.push_back({ alias.declaration, loaded_id });
			}

			auto &incoming_meta = impl.handle_to_resource_meta[resource_id];

			spv::Id offset_buffer_id = get_offset_buffer_variable(impl, resource_type, instruction, resource_range);
			if (offset_buffer_id)
			{
				offset_id = build_load_buffer_offset(impl, reference, incoming_meta,
				                                     offset_buffer_id, offset_id, non_uniform);
			}
			else
				offset_id = 0;

			auto &meta = impl.handle_to_resource_meta[loaded_id];
			meta = incoming_meta;
			meta.non_uniform = is_non_uniform;
			meta.index_offset_id = offset_id;
			meta.var_alias_group = std::move(raw_declarations);
			meta.aliased = reference.aliased;
			meta.rov = reference.rov;
			meta.physical_pointer_meta.coherent = reference.coherent;
			meta.instrumentation = instrumentation;

			// Image atomics requires the pointer to image and not OpTypeImage directly.
			meta.var_id = resource_ptr_id;

			// The base array variable does not know what the stride is, promote that state here.
			if (reference.bindless)
				meta.stride = reference.stride;

			if (is_non_uniform)
			{
				spv::Id type_id = builder.getDerefTypeId(resource_id);
				type_id = builder.getContainedTypeId(type_id);

				if (meta.storage == spv::StorageClassStorageBuffer)
					builder.addCapability(spv::CapabilityStorageBufferArrayNonUniformIndexing);
				else if (builder.getTypeDimensionality(type_id) == spv::DimBuffer)
					builder.addCapability(spv::CapabilityStorageTexelBufferArrayNonUniformIndexing);
				else
					builder.addCapability(spv::CapabilityStorageImageArrayNonUniformIndexing);
				builder.addExtension("SPV_EXT_descriptor_indexing");
			}

			if (impl.llvm_values_using_update_counter.count(instruction) != 0)
			{
				auto &counter_reference = get_resource_counter_reference(impl, instruction, resource_range);

				if (counter_reference.bindless)
				{
					if (counter_reference.resource_kind == DXIL::ResourceKind::RawBuffer)
					{
						meta.counter_var_id = build_load_physical_pointer(impl, counter_reference, instruction_offset, instruction);
						meta.counter_is_physical_pointer = true;
						// Don't support this since the physical pointer we get from heap is actually the counter.
						meta.instrumentation = {};
					}
					else
					{
						if (!build_load_resource_handle(impl, counter_reference.var_id, reference,
						                                DESCRIPTOR_QA_TYPE_RAW_VA_BIT,
						                                instruction, instruction_offset, non_uniform,
						                                is_non_uniform, &meta.counter_var_id, nullptr, nullptr, nullptr))
						{
							LOGE("Failed to load UAV counter pointer.\n");
							return false;
						}
						meta.counter_is_physical_pointer = false;
					}
				}
				else
				{
					meta.counter_var_id = counter_reference.var_id;
					meta.counter_is_physical_pointer = false;
				}
			}
		}
		break;
	}

	case DXIL::ResourceType::CBV:
	{
		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);
		const LocalRootSignatureEntry *local_root_signature_entry = nullptr;
		if (reference.local_root_signature_entry >= 0)
			local_root_signature_entry = &impl.local_root_signature[reference.local_root_signature_entry];

		// Special case root constants since these resources point directly to
		// the push constant block or SBT and not to any concrete resource,
		// so we cannot deduce storage classes properly.

		if (resource_is_physical_pointer(impl, reference))
		{
			spv::Id ptr_id = build_root_descriptor_load_physical_pointer(impl, reference);
			auto &meta = impl.handle_to_resource_meta[ptr_id];
			meta = {};
			meta.stride = reference.stride;
			meta.storage = spv::StorageClassPhysicalStorageBuffer;
			meta.physical_pointer_meta.nonwritable = true;
			meta.kind = reference.resource_kind;
			impl.rewrite_value(instruction, ptr_id);
		}
		else if (reference.var_id != 0 && reference.var_id == impl.root_constant_id)
		{
			// Point directly to root constants.
			impl.rewrite_value(instruction, reference.var_id);
			unsigned member_offset = reference.push_constant_member;
			impl.handle_to_root_member_offset[instruction] = member_offset;
		}
		else if (local_root_signature_entry && local_root_signature_entry->type == LocalRootSignatureType::Constants)
		{
			// Access chain into the desired member once.
			spv::Id id = build_shader_record_access_chain(impl, reference.local_root_signature_entry);

			auto &meta = impl.handle_to_resource_meta[id];
			meta = {};
			meta.storage = spv::StorageClassShaderRecordBufferKHR;
			meta.kind = DXIL::ResourceKind::CBuffer;
			impl.handle_to_root_member_offset[instruction] = reference.local_root_signature_entry;
			impl.rewrite_value(instruction, id);
		}
		else
		{
			bool is_non_uniform = false;

			bool ssbo = reference.bindless && impl.options.bindless_cbv_ssbo_emulation;
			auto storage = ssbo ? spv::StorageClassStorageBuffer : spv::StorageClassUniform;
			auto descriptor_type = ssbo ? DESCRIPTOR_QA_TYPE_STORAGE_BUFFER_BIT : DESCRIPTOR_QA_TYPE_UNIFORM_BUFFER_BIT;

			Vector<Converter::Impl::RawDeclarationVariable> raw_declarations;
			spv::Id loaded_id = 0;
			spv::Id resource_id = 0;
			raw_declarations.reserve(reference.var_alias_group.size());

			Converter::Impl::ResourceMetaInstrumentation instrumentation = {};

			if (reference.var_id)
			{
				resource_id = reference.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type, instruction,
												instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, nullptr, &instrumentation))
				{
					LOGE("Failed to load CBV resource handle.\n");
					return false;
				}
			}

			for (auto &alias : reference.var_alias_group)
			{
				resource_id = alias.var_id;
				if (!build_load_resource_handle(impl, resource_id, reference, descriptor_type,
												instruction, instruction_offset, non_uniform, is_non_uniform,
												nullptr, &loaded_id, nullptr, &instrumentation))
				{
					LOGE("Failed to load CBV resource handle.\n");
					return false;
				}

				raw_declarations.push_back({ alias.declaration, loaded_id });
			}

			auto &incoming_meta = impl.handle_to_resource_meta[resource_id];

			auto &meta = impl.handle_to_resource_meta[loaded_id];
			meta = incoming_meta;
			meta.non_uniform = is_non_uniform;
			meta.storage = storage;
			meta.var_alias_group = std::move(raw_declarations);
			meta.kind = DXIL::ResourceKind::CBuffer;
			meta.instrumentation = instrumentation;

			if (is_non_uniform)
			{
				if (ssbo)
					builder.addCapability(spv::CapabilityStorageBufferArrayNonUniformIndexingEXT);
				else
					builder.addCapability(spv::CapabilityUniformBufferArrayNonUniformIndexingEXT);
				builder.addExtension("SPV_EXT_descriptor_indexing");
			}
		}
		break;
	}

	case DXIL::ResourceType::Sampler:
	{
		auto &reference = get_resource_reference(impl, resource_type, instruction, resource_range);
		spv::Id base_sampler_id = reference.var_id;

		bool is_non_uniform = false;
		spv::Id loaded_id = 0;
		if (!build_load_resource_handle(impl, base_sampler_id, reference, DESCRIPTOR_QA_TYPE_SAMPLER_BIT, instruction,
		                                instruction_offset, non_uniform, is_non_uniform, nullptr, &loaded_id, nullptr, nullptr))
		{
			LOGE("Failed to load Sampler resource handle.\n");
			return false;
		}

		auto &meta = impl.handle_to_resource_meta[loaded_id];
		meta = impl.handle_to_resource_meta[base_sampler_id];
		meta.non_uniform = is_non_uniform;

		if (is_non_uniform)
		{
			builder.addCapability(spv::CapabilitySampledImageArrayNonUniformIndexingEXT);
			builder.addExtension("SPV_EXT_descriptor_indexing");
		}
		break;
	}

	default:
		return false;
	}

	return true;
}